

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalOperator::SetParamsEstimatedCardinality
          (LogicalOperator *this,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *result)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->has_estimated_cardinality == true) {
    ::std::__cxx11::string::string((string *)&local_58,"%llu",&local_79);
    Exception::ConstructMessage<unsigned_long>(&local_38,&local_58,this->estimated_cardinality);
    ::std::__cxx11::string::string((string *)&local_78,"__estimated_cardinality__",&local_7a);
    this_00 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](result,&local_78);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void LogicalOperator::SetParamsEstimatedCardinality(InsertionOrderPreservingMap<string> &result) const {
	if (has_estimated_cardinality) {
		result[RenderTreeNode::ESTIMATED_CARDINALITY] = StringUtil::Format("%llu", estimated_cardinality);
	}
}